

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O3

Var __thiscall
Js::CrossSiteObject<Js::TypedArray<char,_false,_true>_>::GetHostDispatchVar
          (CrossSiteObject<Js::TypedArray<char,_false,_true>_> *this)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  undefined4 *puVar4;
  
  pvVar3 = RecyclableObject::GetHostDispatchVar((RecyclableObject *)this);
  if (pvVar3 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Base/CrossSiteObject.h"
                                ,0xfc,"(hostDispatch)","hostDispatch");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar3 = CrossSite::MarshalVar
                     ((((((this->super_TypedArray<char,_false,_true>).super_TypedArrayBase.
                          super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
                          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr,pvVar3,false);
  return pvVar3;
}

Assistant:

Var CrossSiteObject<T>::GetHostDispatchVar()
    {
        Var hostDispatch = __super::GetHostDispatchVar();
        AssertMsg(hostDispatch, "hostDispatch");
        hostDispatch = CrossSite::MarshalVar(this->GetScriptContext(), hostDispatch);
        return hostDispatch;
    }